

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O3

Aig_Obj_t * Saig_BmcIntervalToAig_rec(Saig_Bmc_t *p,Aig_Man_t *pNew,Aig_Obj_t *pObj)

{
  int iVar1;
  Vec_Int_t *p_00;
  uint uVar2;
  Aig_Obj_t *pAVar3;
  ulong uVar4;
  uint uVar5;
  int Fill;
  Aig_Obj_t *p1;
  
  if ((Aig_Obj_t *)(pObj->field_5).pData != (Aig_Obj_t *)0x0) {
    return (Aig_Obj_t *)(pObj->field_5).pData;
  }
  Vec_IntPush(p->vVisited,pObj->Id);
  p_00 = p->vObj2Var;
  iVar1 = pObj->Id;
  Vec_IntFillExtra(p_00,iVar1 + 1,Fill);
  if (((long)iVar1 < 0) || (p_00->nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar2 = (uint)*(undefined8 *)&pObj->field_0x18 & 7;
  if (p_00->pArray[iVar1] == 0) {
    uVar5 = 0;
    if (uVar2 != 2) {
      Saig_BmcIntervalToAig_rec(p,pNew,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      Saig_BmcIntervalToAig_rec(p,pNew,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
      if ((pObj->field_5).pData != (void *)0x0) {
        __assert_fail("pObj->pData == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmc2.c"
                      ,0x1fc,
                      "Aig_Obj_t *Saig_BmcIntervalToAig_rec(Saig_Bmc_t *, Aig_Man_t *, Aig_Obj_t *)"
                     );
      }
      if (((ulong)pObj & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar4 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
      if (uVar4 == 0) {
        pAVar3 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar3 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar4 + 0x28));
      }
      uVar4 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
      if (uVar4 == 0) {
        p1 = (Aig_Obj_t *)0x0;
      }
      else {
        p1 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar4 + 0x28));
      }
      pAVar3 = Aig_And(pNew,pAVar3,p1);
      goto LAB_0050fa29;
    }
  }
  else {
    uVar5 = (uint)(uVar2 != 2);
  }
  p->nStitchVars = p->nStitchVars + uVar5;
  pAVar3 = Aig_ObjCreateCi(pNew);
LAB_0050fa29:
  (pObj->field_5).pData = pAVar3;
  return pAVar3;
}

Assistant:

Aig_Obj_t * Saig_BmcIntervalToAig_rec( Saig_Bmc_t * p, Aig_Man_t * pNew, Aig_Obj_t * pObj )
{
    if ( pObj->pData )
        return (Aig_Obj_t *)pObj->pData;
    Vec_IntPush( p->vVisited, Aig_ObjId(pObj) );
    if ( Saig_BmcSatNum(p, pObj) || Aig_ObjIsCi(pObj) )
    {
        p->nStitchVars += !Aig_ObjIsCi(pObj);
        return (Aig_Obj_t *)(pObj->pData = Aig_ObjCreateCi(pNew));
    }
    Saig_BmcIntervalToAig_rec( p, pNew, Aig_ObjFanin0(pObj) );
    Saig_BmcIntervalToAig_rec( p, pNew, Aig_ObjFanin1(pObj) );
    assert( pObj->pData == NULL );
    return (Aig_Obj_t *)(pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) ));
}